

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image_utils.cpp
# Opt level: O1

conversion_type crnlib::image_utils::get_conversion_type(bool cooking,pixel_format fmt)

{
  conversion_type cVar1;
  undefined3 in_register_00000039;
  
  cVar1 = cConversion_Invalid;
  if (CONCAT31(in_register_00000039,cooking) == 0) {
    if ((int)fmt < 0x52784778) {
      if (fmt == PIXEL_FMT_3DC) {
        return cConversion_XY_to_XYZ;
      }
      if (fmt == PIXEL_FMT_DXT5_AGBR) {
        cVar1 = cConversion_From_AGBR;
      }
      else if (fmt == PIXEL_FMT_DXT5_xGBR) {
        return cConversion_From_xGBR;
      }
    }
    else {
      if (fmt == PIXEL_FMT_DXT5_xGxR) {
        return cConversion_From_xGxR;
      }
      if (fmt == PIXEL_FMT_DXT5_CCxY) {
        return cConversion_From_CCxY;
      }
      if (fmt == PIXEL_FMT_DXN) {
        return cConversion_XY_to_XYZ;
      }
    }
  }
  else if ((int)fmt < 0x52784778) {
    if (fmt == PIXEL_FMT_DXT5_AGBR) {
      return cConversion_To_AGBR;
    }
    if (fmt == PIXEL_FMT_DXT5_xGBR) {
      return cConversion_To_xGBR;
    }
  }
  else {
    if (fmt == PIXEL_FMT_DXT5_xGxR) {
      return cConversion_To_xGxR;
    }
    if (fmt == PIXEL_FMT_DXT5_CCxY) {
      return cConversion_To_CCxY;
    }
  }
  return cVar1;
}

Assistant:

image_utils::conversion_type get_conversion_type(bool cooking, pixel_format fmt) {
  image_utils::conversion_type conv_type = image_utils::cConversion_Invalid;

  if (cooking) {
    switch (fmt) {
      case PIXEL_FMT_DXT5_CCxY: {
        conv_type = image_utils::cConversion_To_CCxY;
        break;
      }
      case PIXEL_FMT_DXT5_xGxR: {
        conv_type = image_utils::cConversion_To_xGxR;
        break;
      }
      case PIXEL_FMT_DXT5_xGBR: {
        conv_type = image_utils::cConversion_To_xGBR;
        break;
      }
      case PIXEL_FMT_DXT5_AGBR: {
        conv_type = image_utils::cConversion_To_AGBR;
        break;
      }
      default:
        break;
    }
  } else {
    switch (fmt) {
      case PIXEL_FMT_3DC:
      case PIXEL_FMT_DXN: {
        conv_type = image_utils::cConversion_XY_to_XYZ;
        break;
      }
      case PIXEL_FMT_DXT5_CCxY: {
        conv_type = image_utils::cConversion_From_CCxY;
        break;
      }
      case PIXEL_FMT_DXT5_xGxR: {
        conv_type = image_utils::cConversion_From_xGxR;
        break;
      }
      case PIXEL_FMT_DXT5_xGBR: {
        conv_type = image_utils::cConversion_From_xGBR;
        break;
      }
      case PIXEL_FMT_DXT5_AGBR: {
        conv_type = image_utils::cConversion_From_AGBR;
        break;
      }
      default:
        break;
    }
  }

  return conv_type;
}